

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

xmlSchemaValPtr xmlSchemaDateNormalize(xmlSchemaValPtr dt,double offset)

{
  ushort *puVar1;
  xmlSchemaValType xVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  _xmlSchemaVal *p_Var6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  undefined8 uVar10;
  ushort uVar11;
  undefined4 uVar12;
  ushort uVar13;
  uint uVar14;
  xmlSchemaValPtr pxVar15;
  xmlSchemaValPtr pxVar16;
  xmlSchemaValPtr value;
  xmlChar *pxVar17;
  long lVar18;
  uint *puVar19;
  ulong uVar20;
  xmlChar *pxVar21;
  xmlChar *pxVar22;
  xmlSchemaValType xVar23;
  ulong uVar24;
  xmlSchemaValPtr pxVar25;
  uint uVar26;
  uint *puVar27;
  bool bVar28;
  bool bVar29;
  double dVar30;
  
  xVar2 = dt->type;
  if (((XML_SCHEMAS_DATETIME < xVar2) || ((0xc10U >> (xVar2 & XML_SCHEMAS_NPINTEGER) & 1) == 0)) ||
     ((*(ushort *)((long)&dt->value + 0x18) & 0x1ffe) == 0)) {
    pxVar15 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
    if (pxVar15 == (xmlSchemaValPtr)0x0) {
      pxVar15 = (xmlSchemaValPtr)0x0;
    }
    else {
      *(undefined8 *)pxVar15 = 0;
      pxVar15->next = (_xmlSchemaVal *)0x0;
      (pxVar15->value).decimal.hi = 0;
      *(undefined8 *)((long)&pxVar15->value + 0x18) = 0;
      (pxVar15->value).decimal.lo = 0;
      (pxVar15->value).decimal.mi = 0;
      pxVar15->type = xVar2;
    }
    if (pxVar15 == (xmlSchemaValPtr)0x0) {
      return (xmlSchemaValPtr)0x0;
    }
    uVar12 = *(undefined4 *)&dt->field_0x4;
    p_Var6 = dt->next;
    uVar7 = (dt->value).decimal.lo;
    uVar8 = (dt->value).decimal.mi;
    uVar9 = (dt->value).decimal.hi;
    uVar10 = *(undefined8 *)((long)&dt->value + 0x18);
    pxVar15->type = dt->type;
    *(undefined4 *)&pxVar15->field_0x4 = uVar12;
    pxVar15->next = p_Var6;
    (pxVar15->value).decimal.hi = uVar9;
    *(undefined8 *)((long)&pxVar15->value + 0x18) = uVar10;
    (pxVar15->value).decimal.lo = uVar7;
    (pxVar15->value).decimal.mi = uVar8;
    pxVar15->next = (_xmlSchemaVal *)0x0;
    return pxVar15;
  }
  pxVar15 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
  if (pxVar15 == (xmlSchemaValPtr)0x0) {
    pxVar15 = (xmlSchemaValPtr)0x0;
  }
  else {
    *(undefined8 *)pxVar15 = 0;
    pxVar15->next = (_xmlSchemaVal *)0x0;
    (pxVar15->value).decimal.hi = 0;
    *(undefined8 *)((long)&pxVar15->value + 0x18) = 0;
    (pxVar15->value).decimal.lo = 0;
    (pxVar15->value).decimal.mi = 0;
    pxVar15->type = XML_SCHEMAS_DURATION;
  }
  if (pxVar15 == (xmlSchemaValPtr)0x0) {
    return (xmlSchemaValPtr)0x0;
  }
  (pxVar15->value).date.sec = (pxVar15->value).date.sec - offset;
  xVar2 = dt->type;
  pxVar16 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
  if (pxVar16 == (xmlSchemaValPtr)0x0) {
    pxVar16 = (xmlSchemaValPtr)0x0;
  }
  else {
    *(undefined8 *)pxVar16 = 0;
    pxVar16->next = (_xmlSchemaVal *)0x0;
    (pxVar16->value).decimal.hi = 0;
    *(undefined8 *)((long)&pxVar16->value + 0x18) = 0;
    (pxVar16->value).decimal.lo = 0;
    (pxVar16->value).decimal.mi = 0;
    pxVar16->type = xVar2;
  }
  if (pxVar16 == (xmlSchemaValPtr)0x0) {
    pxVar25 = (xmlSchemaValPtr)0x0;
    goto LAB_001cffc3;
  }
  xVar2 = dt->type;
  value = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
  if (value == (xmlSchemaValPtr)0x0) {
    value = (xmlSchemaValPtr)0x0;
  }
  else {
    *(undefined8 *)value = 0;
    value->next = (_xmlSchemaVal *)0x0;
    (value->value).decimal.hi = 0;
    *(undefined8 *)((long)&value->value + 0x18) = 0;
    (value->value).decimal.lo = 0;
    (value->value).decimal.mi = 0;
    value->type = xVar2;
  }
  if (value == (xmlSchemaValPtr)0x0) {
    value = (xmlSchemaValPtr)0x0;
  }
  else {
    uVar12 = *(undefined4 *)&dt->field_0x4;
    p_Var6 = dt->next;
    uVar7 = (dt->value).decimal.lo;
    uVar8 = (dt->value).decimal.mi;
    uVar9 = (dt->value).decimal.hi;
    uVar10 = *(undefined8 *)((long)&dt->value + 0x18);
    value->type = dt->type;
    *(undefined4 *)&value->field_0x4 = uVar12;
    value->next = p_Var6;
    (value->value).decimal.hi = uVar9;
    *(undefined8 *)((long)&value->value + 0x18) = uVar10;
    (value->value).decimal.lo = uVar7;
    (value->value).decimal.mi = uVar8;
    value->next = (_xmlSchemaVal *)0x0;
  }
  if (value != (xmlSchemaValPtr)0x0) {
    uVar26 = (value->value).hex.total;
    if ((uVar26 & 0xf) == 0) {
      (value->value).hex.total = uVar26 | 1;
    }
    (pxVar15->value).date.sec =
         (pxVar15->value).date.sec -
         (double)(((int)(short)((value->value).decimal.extra << 3) >> 4) * 0x3c);
    puVar1 = (ushort *)((long)&value->value + 0x18);
    *puVar1 = *puVar1 & 0xe001;
    uVar26 = (value->value).hex.total;
    if ((uVar26 & 0x1f0) == 0) {
      (value->value).hex.total = uVar26 | 0x10;
    }
    dVar30 = (double)(long)((pxVar15->value).qname.name +
                           ((ulong)((value->value).hex.total & 0xf) - 1));
    dVar4 = floor(dVar30 / 12.0);
    (pxVar16->value).hex.total =
         (pxVar16->value).hex.total & 0xfffffff0 | (uint)(long)((dVar30 - dVar4 * 12.0) + 1.0) & 0xf
    ;
    pxVar17 = (value->value).qname.name + (long)dVar4;
    (pxVar16->value).qname.name = pxVar17;
    if (pxVar17 == (xmlChar *)0x0) {
      (pxVar16->value).qname.name = (xmlChar *)((ulong)((value->value).date.year < 1) * 2 + -1);
    }
    uVar13 = *(ushort *)((long)&value->value + 0x18) & 0x1ffe;
    uVar11 = (ushort)(pxVar16->value).decimal.extra;
    *(ushort *)((long)&pxVar16->value + 0x18) = uVar11 & 0xe001 | uVar13;
    *(ushort *)((long)&pxVar16->value + 0x18) =
         uVar11 & 0xe000 | uVar13 | *(ushort *)((long)&value->value + 0x18) & 1;
    dVar30 = (value->value).date.sec + (pxVar15->value).date.sec;
    dVar4 = floor((double)(long)dVar30 / 60.0);
    if ((dVar30 != 0.0) || (NAN(dVar30))) {
      dVar5 = floor(dVar30 / 60.0);
      dVar30 = dVar30 - dVar5 * 60.0;
    }
    (pxVar16->value).date.sec = dVar30;
    dVar30 = (double)(long)((ulong)((value->value).hex.total >> 0xe & 0x3f) + (long)dVar4);
    dVar4 = floor(dVar30 / 60.0);
    uVar26 = (pxVar16->value).hex.total;
    uVar14 = ((uint)(long)(dVar30 - dVar4 * 60.0) & 0x3f) << 0xe;
    (pxVar16->value).hex.total = uVar26 & 0xfff03fff | uVar14;
    dVar30 = (double)(long)((ulong)((value->value).hex.total >> 9 & 0x1f) + (long)dVar4);
    dVar4 = floor(dVar30 / 24.0);
    (pxVar16->value).hex.total =
         uVar26 & 0xfff001ff | uVar14 | ((uint)(long)(dVar30 - dVar4 * 24.0) & 0x1f) << 9;
    uVar20 = (pxVar16->value).decimal.lo;
    if ((uVar20 != 0) && (uVar26 = (uVar26 & 0xf) - 1, uVar26 < 0xc)) {
      bVar29 = (uVar20 & 3) == 0;
      lVar18 = uVar20 * -0x70a3d70a3d70a3d7;
      bVar3 = 0x28f5c28f5c28f5c < (lVar18 + 0x51eb851eb851eb8U >> 2 | lVar18 << 0x3e);
      bVar28 = (lVar18 + 0x51eb851eb851eb0U >> 4 | lVar18 << 0x3c) < 0xa3d70a3d70a3d7;
      puVar27 = daysInMonth;
      puVar19 = daysInMonth;
      if (bVar28 || bVar3 && bVar29) {
        puVar19 = daysInMonthLeap;
      }
      if (puVar19[uVar26] < ((value->value).hex.total >> 4 & 0x1f)) {
        if (bVar28 || bVar3 && bVar29) {
          puVar27 = daysInMonthLeap;
        }
        uVar26 = puVar27[uVar26];
        goto LAB_001cfd2a;
      }
    }
    uVar26 = (value->value).hex.total >> 4 & 0x1f;
    uVar26 = uVar26 + (uVar26 == 0);
LAB_001cfd2a:
    pxVar17 = (pxVar15->value).qname.uri + (ulong)uVar26 + (long)dVar4;
    do {
      if ((long)pxVar17 < 1) {
        dVar30 = (double)(int)(((pxVar16->value).hex.total & 0xf) - 2);
        dVar4 = floor(dVar30 / 12.0);
        uVar20 = (ulong)((dVar30 - dVar4 * 12.0) + 1.0);
        pxVar22 = (pxVar16->value).qname.name + (long)dVar4;
        uVar24 = -(ulong)(pxVar22 == (xmlChar *)0x0) | (ulong)pxVar22;
        if ((long)uVar20 < 2) {
          uVar20 = 1;
        }
        if (0xb < (long)uVar20) {
          uVar20 = 0xc;
        }
        lVar18 = uVar24 * -0x70a3d70a3d70a3d7;
        puVar19 = daysInMonth;
        if (0x28f5c28f5c28f5c < (lVar18 + 0x51eb851eb851eb8U >> 2 | lVar18 << 0x3e)) {
          puVar19 = daysInMonthLeap;
        }
        if ((uVar24 & 3) != 0) {
          puVar19 = daysInMonth;
        }
        if ((lVar18 + 0x51eb851eb851eb0U >> 4 | lVar18 << 0x3c) < 0xa3d70a3d70a3d7) {
          puVar19 = daysInMonthLeap;
        }
        uVar20 = (ulong)puVar19[(uVar20 & 0xffffffff) - 1];
        lVar18 = -1;
      }
      else {
        uVar20 = (pxVar16->value).decimal.lo;
        if ((uVar20 == 0) || (uVar26 = ((pxVar16->value).hex.total & 0xf) - 1, 0xb < uVar26))
        goto LAB_001cff67;
        bVar29 = (uVar20 & 3) == 0;
        lVar18 = uVar20 * -0x70a3d70a3d70a3d7;
        bVar3 = 0x28f5c28f5c28f5c < (lVar18 + 0x51eb851eb851eb8U >> 2 | lVar18 << 0x3e);
        bVar28 = (lVar18 + 0x51eb851eb851eb0U >> 4 | lVar18 << 0x3c) < 0xa3d70a3d70a3d7;
        puVar19 = daysInMonth;
        if (bVar28 || bVar3 && bVar29) {
          puVar19 = daysInMonthLeap;
        }
        if ((long)pxVar17 <= (long)(ulong)puVar19[uVar26]) goto LAB_001cff67;
        puVar19 = daysInMonth;
        if (bVar28 || bVar3 && bVar29) {
          puVar19 = daysInMonthLeap;
        }
        uVar20 = -(ulong)puVar19[uVar26];
        lVar18 = 1;
      }
      pxVar17 = pxVar17 + uVar20;
      uVar26 = (pxVar16->value).hex.total;
      lVar18 = (ulong)(uVar26 & 0xf) + lVar18;
      dVar30 = (double)((int)lVar18 + -1);
      dVar4 = floor(dVar30 / 12.0);
      (pxVar16->value).hex.total =
           uVar26 & 0xfffffff0 | (uint)(long)((dVar30 - dVar4 * 12.0) + 1.0) & 0xf;
      pxVar21 = (pxVar16->value).qname.name + (long)dVar4;
      pxVar22 = (xmlChar *)((ulong)(0 < lVar18) * 2 + -1);
      if (pxVar21 != (xmlChar *)0x0) {
        pxVar22 = pxVar21;
      }
      (pxVar16->value).qname.name = pxVar22;
    } while( true );
  }
  pxVar25 = (xmlSchemaValPtr)0x0;
  value = pxVar16;
LAB_001cffbe:
  xmlSchemaFreeValue(value);
LAB_001cffc3:
  if (pxVar25 == (xmlSchemaValPtr)0x0) {
    return (xmlSchemaValPtr)0x0;
  }
  xmlSchemaFreeValue(pxVar15);
  return pxVar25;
LAB_001cff67:
  xVar2 = pxVar16->type;
  uVar26 = (pxVar16->value).hex.total;
  uVar14 = (uint)pxVar17 & 0x1f;
  (pxVar16->value).hex.total = uVar26 & 0xfffffe0f | uVar14 << 4;
  pxVar25 = pxVar16;
  if ((xVar2 != XML_SCHEMAS_DATETIME) &&
     ((((xVar23 = XML_SCHEMAS_DATETIME, (uVar26 & 0xffe00) != 0 ||
        (dVar30 = (pxVar16->value).date.sec, dVar30 != 0.0)) || (NAN(dVar30))) ||
      ((xVar2 != XML_SCHEMAS_DATE &&
       (((uVar14 != 1 && (xVar23 = XML_SCHEMAS_DATE, (uVar26 & 0xf) != 1)) ||
        (xVar23 = XML_SCHEMAS_GYEARMONTH, xVar2 != XML_SCHEMAS_GYEARMONTH && (uVar26 & 0xf) != 1))))
      )))) {
    pxVar16->type = xVar23;
  }
  goto LAB_001cffbe;
}

Assistant:

static xmlSchemaValPtr
xmlSchemaDateNormalize (xmlSchemaValPtr dt, double offset)
{
    xmlSchemaValPtr dur, ret;

    if (dt == NULL)
        return NULL;

    if (((dt->type != XML_SCHEMAS_TIME) &&
         (dt->type != XML_SCHEMAS_DATETIME) &&
	 (dt->type != XML_SCHEMAS_DATE)) || (dt->value.date.tzo == 0))
        return xmlSchemaDupVal(dt);

    dur = xmlSchemaNewValue(XML_SCHEMAS_DURATION);
    if (dur == NULL)
        return NULL;

    dur->value.date.sec -= offset;

    ret = _xmlSchemaDateAdd(dt, dur);
    if (ret == NULL)
        return NULL;

    xmlSchemaFreeValue(dur);

    /* ret->value.date.tzo = 0; */
    return ret;
}